

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O0

ssize_t __thiscall
hbm::SocketNonblocking::sendBlock(SocketNonblocking *this,void *pBlock,size_t size,bool more)

{
  int iVar1;
  int *piVar2;
  byte in_CL;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  bool bVar3;
  int err;
  int flags;
  pollfd pfd;
  ssize_t retVal;
  ssize_t numBytes;
  size_t BytesLeft;
  uint8_t *pDat;
  int local_4c;
  pollfd local_48;
  size_t local_40;
  ssize_t local_38;
  size_t local_30;
  void *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_48.fd = *(int *)(in_RDI + 8);
  local_48.events = 4;
  local_4c = 0;
  local_40 = in_RDX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  if (local_19 != 0) {
    local_4c = 0x8000;
  }
  while (local_30 != 0) {
    local_38 = send(*(int *)(in_RDI + 8),local_28,local_30,local_4c);
    if (local_38 < 1) {
      if (local_38 == 0) {
        local_30 = 0;
        local_40 = 0xffffffffffffffff;
      }
      else {
        piVar2 = __errno_location();
        if ((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) {
          do {
            iVar1 = poll(&local_48,1,-1);
            bVar3 = false;
            if (iVar1 == -1) {
              piVar2 = __errno_location();
              bVar3 = *piVar2 == 4;
            }
          } while (bVar3);
          if (iVar1 != 1) {
            local_30 = 0;
            local_40 = 0xffffffffffffffff;
          }
        }
        else {
          local_30 = 0;
          local_40 = 0xffffffffffffffff;
        }
      }
    }
    else {
      local_28 = (void *)(local_38 + (long)local_28);
      local_30 = local_30 - local_38;
    }
  }
  return local_40;
}

Assistant:

ssize_t hbm::SocketNonblocking::sendBlock(const void* pBlock, size_t size, bool more)
{
	const uint8_t* pDat = reinterpret_cast<const uint8_t*>(pBlock);
	size_t BytesLeft = size;
	ssize_t numBytes;
	ssize_t retVal = size;

	struct pollfd pfd;
	pfd.fd = m_fd;
	pfd.events = POLLOUT;

	int flags = 0;
	if(more) {
		flags |= MSG_MORE;
	}
	int err;

	while (BytesLeft > 0) {
		numBytes = send(m_fd, pDat, BytesLeft, flags);
		if(numBytes>0) {
			pDat += numBytes;
			BytesLeft -= numBytes;
		} else if(numBytes==0) {
			// connection lost...
			BytesLeft = 0;
			retVal = -1;
		} else {
			// <0
			if(errno==EWOULDBLOCK || errno==EAGAIN) {
				// wait for socket to become writable.
				do {
					err = poll(&pfd, 1, -1);
				} while((err==-1) && (errno==EINTR));
				if(err!=1) {
					BytesLeft = 0;
					retVal = -1;
				}
			} else {
				// a real error happened!
				BytesLeft = 0;
				retVal = -1;
			}
		}
	}
	return retVal;
}